

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseEncodedCharacterString3(CFIReaderImpl *this)

{
  byte bVar1;
  byte bVar2;
  Assimp *this_00;
  uint8_t *data;
  byte *pbVar3;
  DeadlyImportError *pDVar4;
  size_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  CFIReaderImpl *in_RSI;
  ulong len;
  shared_ptr<const_Assimp::FIValue> sVar6;
  undefined1 auStack_58 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
       (_func_int **)0x0;
  (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  bVar1 = *in_RSI->dataP;
  if ((bVar1 & 0x20) == 0) {
    data = (uint8_t *)parseNonEmptyOctetString5Length(in_RSI);
    this_00 = (Assimp *)in_RSI->dataP;
    if ((long)in_RSI->dataEnd - (long)this_00 < (long)data) {
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
LAB_00538099:
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((bVar1 & 0x10) == 0) {
      parseUTF8String_abi_cxx11_((string *)auStack_58,this_00,data,in_RCX);
      FIStringValue::create((string *)(auStack_58 + 0x20));
    }
    else {
      if (((ulong)data & 1) != 0) {
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
        goto LAB_00538099;
      }
      parseUTF16String_abi_cxx11_((string *)auStack_58,this_00,data,in_RCX);
      FIStringValue::create((string *)(auStack_58 + 0x20));
    }
    std::__shared_ptr<Assimp::FIValue_const,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Assimp::FIValue_const,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Assimp::FIStringValue,_(__gnu_cxx::_Lock_policy)2> *)
               (auStack_58 + 0x20));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    std::__cxx11::string::~string((string *)auStack_58);
    _Var5._M_pi = extraout_RDX;
  }
  else {
    pbVar3 = in_RSI->dataP + 1;
    in_RSI->dataP = pbVar3;
    if ((long)in_RSI->dataEnd - (long)pbVar3 < 1) {
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
      goto LAB_00538099;
    }
    bVar2 = *pbVar3;
    data = (uint8_t *)parseNonEmptyOctetString5Length(in_RSI);
    if ((long)in_RSI->dataEnd - (long)in_RSI->dataP < (long)data) {
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    len = (ulong)((uint)(bVar2 >> 4) | (bVar1 & 0xf) << 4);
    if ((bVar1 & 0x10) == 0) {
      parseRestrictedAlphabet((CFIReaderImpl *)auStack_58,(size_t)in_RSI,len);
    }
    else {
      parseEncodedData((CFIReaderImpl *)auStack_58,(size_t)in_RSI,len);
    }
    std::__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2> *)auStack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
    _Var5._M_pi = extraout_RDX_00;
  }
  in_RSI->dataP = in_RSI->dataP + (long)data;
  sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const FIValue> parseEncodedCharacterString3() { // C.19
        std::shared_ptr<const FIValue> result;
        size_t len;
        uint8_t b = *dataP;
        if (b & 0x20) {
            ++dataP;
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            size_t index = ((b & 0x0f) << 4) | ((*dataP & 0xf0) >> 4); // C.29
            len = parseNonEmptyOctetString5Length();
            if (dataEnd - dataP < static_cast<ptrdiff_t>(len)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            if (b & 0x10) {
                // encoding algorithm (C.19.3.4)
                result = parseEncodedData(index, len);
            }
            else {
                // Restricted alphabet (C.19.3.3)
                result = parseRestrictedAlphabet(index, len);
            }
        }
        else {
            len = parseNonEmptyOctetString5Length();
            if (dataEnd - dataP < static_cast<ptrdiff_t>(len)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            if (b & 0x10) {
                // UTF-16 (C.19.3.2)
                if (len & 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                result = FIStringValue::create(parseUTF16String(dataP, len));
            }
            else {
                // UTF-8 (C.19.3.1)
                result = FIStringValue::create(parseUTF8String(dataP, len));
            }
        }
        dataP += len;
        return result;
    }